

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::CollectOriginalDirectories(cmOrderDirectories *this)

{
  size_type sVar1;
  reference ppcVar2;
  uint local_14;
  uint i;
  cmOrderDirectories *this_local;
  
  AddOriginalDirectories(this,&this->UserDirectories);
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ::size(&this->ConstraintEntries);
    if (sVar1 <= local_14) break;
    ppcVar2 = std::
              vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ::operator[](&this->ConstraintEntries,(ulong)local_14);
    cmOrderDirectoriesConstraint::AddDirectory(*ppcVar2);
    local_14 = local_14 + 1;
  }
  AddOriginalDirectories(this,&this->LanguageDirectories);
  return;
}

Assistant:

void cmOrderDirectories::CollectOriginalDirectories()
{
  // Add user directories specified for inclusion.  These should be
  // indexed first so their original order is preserved as much as
  // possible subject to the constraints.
  this->AddOriginalDirectories(this->UserDirectories);

  // Add directories containing constraints.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->AddDirectory();
  }

  // Add language runtime directories last.
  this->AddOriginalDirectories(this->LanguageDirectories);
}